

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

bool __thiscall
PruneReplayer::enqueue_create_compute_pipeline
          (PruneReplayer *this,Hash hash,VkComputePipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  __hashtable *__h_1;
  __node_gen_type __node_gen;
  Hash local_28;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_20;
  VkShaderModule local_18;
  
  *pipeline = (VkPipeline)hash;
  local_28 = hash;
  bVar1 = filter_object(this,RESOURCE_COMPUTE_PIPELINE,hash);
  if (bVar1) {
    bVar1 = filter_shader_module(this,(Hash)(create_info->stage).module);
    if (bVar1) {
      access_pipeline_layout(this,(Hash)create_info->layout);
      local_20 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->accessed_shader_modules;
      local_18 = (create_info->stage).module;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                (local_20,&local_18,&local_20);
      local_20 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->accessed_compute_pipelines;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                (local_20,&local_28,&local_20);
    }
  }
  return true;
}

Assistant:

bool enqueue_create_compute_pipeline(Hash hash, const VkComputePipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		if (filter_object(RESOURCE_COMPUTE_PIPELINE, hash))
		{
			bool allow_pipeline = filter_shader_module((Hash)create_info->stage.module);

			if (allow_pipeline)
			{
				access_pipeline_layout((Hash) create_info->layout);
				accessed_shader_modules.insert((Hash) create_info->stage.module);
				accessed_compute_pipelines.insert(hash);
			}
		}
		return true;
	}